

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::javanano::EnumGenerator::Generate(EnumGenerator *this,Printer *printer)

{
  bool bVar1;
  bool bVar2;
  pointer ppEVar3;
  pointer pAVar4;
  int i_00;
  int i_1;
  long lVar5;
  char *pcVar6;
  int i;
  ulong uVar7;
  int i_2;
  string constant_name;
  string classname;
  string local_90;
  string local_70;
  string local_50;
  
  io::Printer::Print(printer,"\n// enum $classname$\n","classname",*(string **)this->descriptor_);
  RenameJavaKeywords(&local_50,*(string **)this->descriptor_);
  bVar1 = this->params_->java_enum_style_;
  bVar2 = this->params_->generate_intdefs_;
  if (bVar2 == true) {
    io::Printer::Print(printer,
                       "@java.lang.annotation.Retention(java.lang.annotation.RetentionPolicy.SOURCE)\n@android.support.annotation.IntDef({\n"
                      );
    io::Printer::Indent(printer);
    for (uVar7 = 0;
        ppEVar3 = (this->canonical_values_).
                  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start,
        uVar7 < (ulong)((long)(this->canonical_values_).
                              super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
        uVar7 = uVar7 + 1) {
      RenameJavaKeywords(&local_90,*(string **)ppEVar3[uVar7]);
      if (bVar1 == false) {
        io::Printer::Print(printer,"$name$,\n","name",&local_90);
      }
      else {
        io::Printer::Print(printer,"$classname$.$name$,\n","classname",&local_50,"name",&local_90);
      }
      std::__cxx11::string::~string((string *)&local_90);
    }
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"})\n");
  }
  if ((bVar2 | bVar1) == 1) {
    pcVar6 = "";
    if (bVar2 != false) {
      pcVar6 = "@";
    }
    std::__cxx11::string::string((string *)&local_90,pcVar6,(allocator *)&local_70);
    io::Printer::Print(printer,"public $at_for_intdef$interface $classname$ {\n","classname",
                       &local_50,"at_for_intdef",&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar1 == false) {
      io::Printer::Print(printer,"}\n\n");
    }
    else {
      io::Printer::Indent(printer);
    }
  }
  for (uVar7 = 0;
      ppEVar3 = (this->canonical_values_).
                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->canonical_values_).
                            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppEVar3 >> 3);
      uVar7 = uVar7 + 1) {
    RenameJavaKeywords(&local_90,*(string **)ppEVar3[uVar7]);
    SimpleItoa_abi_cxx11_
              (&local_70,
               (protobuf *)
               (ulong)*(uint *)((this->canonical_values_).
                                super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[uVar7] + 0x10),i_00);
    io::Printer::Print(printer,"public static final int $name$ = $canonical_value$;\n","name",
                       &local_90,"canonical_value",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
  }
  lVar5 = 0;
  for (uVar7 = 0;
      pAVar4 = (this->aliases_).
               super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)((long)(this->aliases_).
                            super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar4 >> 4);
      uVar7 = uVar7 + 1) {
    RenameJavaKeywords(&local_90,(string *)**(undefined8 **)((long)&pAVar4->value + lVar5));
    RenameJavaKeywords(&local_70,
                       (string *)
                       **(undefined8 **)
                         ((long)&((this->aliases_).
                                  super__Vector_base<google::protobuf::compiler::javanano::EnumGenerator::Alias,_std::allocator<google::protobuf::compiler::javanano::EnumGenerator::Alias>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->canonical_value +
                         lVar5));
    io::Printer::Print(printer,"public static final int $name$ = $canonical_name$;\n","name",
                       &local_90,"canonical_name",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    lVar5 = lVar5 + 0x10;
  }
  if (bVar1 != false) {
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"}\n");
  }
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void EnumGenerator::Generate(io::Printer* printer) {
  printer->Print(
      "\n"
      "// enum $classname$\n",
      "classname", descriptor_->name());

  const string classname = RenameJavaKeywords(descriptor_->name());

  // Start of container interface
  // If generating intdefs, we use the container interface as the intdef if
  // present. Otherwise, we just make an empty @interface parallel to the
  // constants.
  bool use_intdef = params_.generate_intdefs();
  bool use_shell_class = params_.java_enum_style();
  if (use_intdef) {
    // @IntDef annotation so tools can enforce correctness
    // Annotations will be discarded by the compiler
    printer->Print("@java.lang.annotation.Retention("
      "java.lang.annotation.RetentionPolicy.SOURCE)\n"
      "@android.support.annotation.IntDef({\n");
    printer->Indent();
    for (int i = 0; i < canonical_values_.size(); i++) {
      const string constant_name =
          RenameJavaKeywords(canonical_values_[i]->name());
      if (use_shell_class) {
        printer->Print("$classname$.$name$,\n",
          "classname", classname,
          "name", constant_name);
      } else {
        printer->Print("$name$,\n", "name", constant_name);
      }
    }
    printer->Outdent();
    printer->Print("})\n");
  }
  if (use_shell_class || use_intdef) {
    printer->Print(
      "public $at_for_intdef$interface $classname$ {\n",
      "classname", classname,
      "at_for_intdef", use_intdef ? "@" : "");
    if (use_shell_class) {
        printer->Indent();
    } else {
        printer->Print("}\n\n");
    }
  }

  // Canonical values
  for (int i = 0; i < canonical_values_.size(); i++) {
    printer->Print(
      "public static final int $name$ = $canonical_value$;\n",
      "name", RenameJavaKeywords(canonical_values_[i]->name()),
      "canonical_value", SimpleItoa(canonical_values_[i]->number()));
  }

  // Aliases
  for (int i = 0; i < aliases_.size(); i++) {
    printer->Print(
      "public static final int $name$ = $canonical_name$;\n",
      "name", RenameJavaKeywords(aliases_[i].value->name()),
      "canonical_name", RenameJavaKeywords(aliases_[i].canonical_value->name()));
  }

  // End of container interface
  if (use_shell_class) {
    printer->Outdent();
    printer->Print("}\n");
  }
}